

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

int mbedtls_sha256_update(mbedtls_sha256_context *ctx,uchar *input,size_t ilen)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong __n;
  long lVar4;
  uint uVar5;
  
  if (ilen == 0) {
    iVar3 = 0;
  }
  else {
    uVar5 = ctx->total[0];
    uVar2 = uVar5 & 0x3f;
    ctx->total[0] = (uint)ilen + uVar5;
    if (CARRY4((uint)ilen,uVar5)) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    uVar5 = 0;
    if (uVar2 != 0) {
      __n = 0x40 - (ulong)uVar2;
      uVar5 = uVar2;
      if (__n <= ilen) {
        switchD_00b1522a::default(ctx->buffer + uVar2,input,__n);
        mbedtls_internal_sha256_process(ctx,ctx->buffer);
        input = input + __n;
        ilen = ilen - __n;
        uVar5 = 0;
      }
    }
    do {
      if (ilen < 0x40) {
        if (ilen == 0) {
          return 0;
        }
        switchD_00b1522a::default(ctx->buffer + uVar5,input,ilen);
        return 0;
      }
      lVar4 = 0;
      do {
        mbedtls_internal_sha256_process(ctx,input);
        input = input + 0x40;
        lVar1 = ilen + lVar4;
        lVar4 = lVar4 + -0x40;
      } while (0x3f < lVar1 - 0x40U);
      ilen = ilen + lVar4;
    } while (lVar4 != 0);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int mbedtls_sha256_update(mbedtls_sha256_context *ctx,
                          const unsigned char *input,
                          size_t ilen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t fill;
    uint32_t left;

    if (ilen == 0) {
        return 0;
    }

    left = ctx->total[0] & 0x3F;
    fill = SHA256_BLOCK_SIZE - left;

    ctx->total[0] += (uint32_t) ilen;
    ctx->total[0] &= 0xFFFFFFFF;

    if (ctx->total[0] < (uint32_t) ilen) {
        ctx->total[1]++;
    }

    if (left && ilen >= fill) {
        memcpy((void *) (ctx->buffer + left), input, fill);

        if ((ret = mbedtls_internal_sha256_process(ctx, ctx->buffer)) != 0) {
            return ret;
        }

        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while (ilen >= SHA256_BLOCK_SIZE) {
        size_t processed =
            mbedtls_internal_sha256_process_many(ctx, input, ilen);
        if (processed < SHA256_BLOCK_SIZE) {
            return MBEDTLS_ERR_ERROR_GENERIC_ERROR;
        }

        input += processed;
        ilen  -= processed;
    }

    if (ilen > 0) {
        memcpy((void *) (ctx->buffer + left), input, ilen);
    }

    return 0;
}